

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86_avx::forward_inplace
          (HardSigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  float fVar16;
  
  iVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar7 = 0;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar7;
  }
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar12._16_4_ = 0x3f800000;
  auVar12._20_4_ = 0x3f800000;
  auVar12._24_4_ = 0x3f800000;
  auVar12._28_4_ = 0x3f800000;
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar8 = (undefined1 (*) [32])(sVar4 * uVar7 * sVar3 + (long)pvVar2);
    lVar9 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar5; iVar11 = iVar11 + 8) {
      fVar1 = (this->super_HardSigmoid).beta;
      fVar16 = (this->super_HardSigmoid).alpha;
      auVar15._0_4_ = fVar16 * *(float *)*pauVar8 + fVar1;
      auVar15._4_4_ = fVar16 * *(float *)(*pauVar8 + 4) + fVar1;
      auVar15._8_4_ = fVar16 * *(float *)(*pauVar8 + 8) + fVar1;
      auVar15._12_4_ = fVar16 * *(float *)(*pauVar8 + 0xc) + fVar1;
      auVar15._16_4_ = fVar16 * *(float *)(*pauVar8 + 0x10) + fVar1;
      auVar15._20_4_ = fVar16 * *(float *)(*pauVar8 + 0x14) + fVar1;
      auVar15._24_4_ = fVar16 * *(float *)(*pauVar8 + 0x18) + fVar1;
      auVar15._28_4_ = fVar16 + fVar1;
      auVar15 = vmaxps_avx(auVar15,ZEXT1632(ZEXT816(0) << 0x40));
      auVar15 = vminps_avx(auVar15,auVar12);
      *pauVar8 = auVar15;
      pauVar8 = pauVar8 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar11 + 3 < iVar5; iVar11 = iVar11 + 4) {
      fVar1 = (this->super_HardSigmoid).alpha;
      fVar16 = (this->super_HardSigmoid).beta;
      auVar14._0_4_ = fVar1 * *(float *)*pauVar8 + fVar16;
      auVar14._4_4_ = fVar1 * *(float *)(*pauVar8 + 4) + fVar16;
      auVar14._8_4_ = fVar1 * *(float *)(*pauVar8 + 8) + fVar16;
      auVar14._12_4_ = fVar1 * *(float *)(*pauVar8 + 0xc) + fVar16;
      auVar14 = vmaxps_avx(auVar14,ZEXT816(0) << 0x40);
      auVar14 = vminps_avx(auVar14,auVar13);
      *(undefined1 (*) [16])*pauVar8 = auVar14;
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar10 = sVar4 * sVar3 * uVar7;
    for (; (int)lVar9 < iVar5; lVar9 = lVar9 + 1) {
      fVar1 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar10);
      fVar16 = 0.0;
      if (((this->super_HardSigmoid).lower <= fVar1) &&
         (fVar16 = 1.0, fVar1 <= (this->super_HardSigmoid).upper)) {
        fVar16 = fVar1 * (this->super_HardSigmoid).alpha + (this->super_HardSigmoid).beta;
      }
      *(float *)((long)pvVar2 + lVar9 * 4 + lVar10) = fVar16;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}